

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_closed_process_io(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 auVar3 [16];
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_stdio_container_t stdio [2];
  undefined8 local_1d0;
  uv_buf_t buf;
  uv_write_t write_req;
  uv_pipe_t in;
  
  init_process_options("spawn_helper3",exit_cb);
  uVar2 = uv_default_loop();
  uv_pipe_init(uVar2,&write_req.bufsml[3].len,0);
  options.stdio = (uv_stdio_container_t *)&eval_a;
  eval_a._0_4_ = 0x11;
  stdio[0]._0_8_ = &write_req.bufsml[3].len;
  options.stdio_count = 1;
  close(0);
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x3fd,"uv_spawn(uv_default_loop(), &process, &options)","==","0",(long)iVar1,"==",0);
    abort();
  }
  auVar3 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
  buf.base = auVar3._8_8_;
  local_1d0 = auVar3._0_8_;
  iVar1 = uv_write(&buf.len,&write_req.bufsml[3].len,&local_1d0,1,write_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x400,"uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x402,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x404,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
    abort();
  }
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x405,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x407,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_closed_process_io) {
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  static char buffer[] = "hello-from-spawn_stdin\n";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  close(0); /* Close process stdin. */

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init(buffer, sizeof(buffer));
  ASSERT_OK(uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(2, close_cb_called); /* process, child stdin */

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}